

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.hpp
# Opt level: O2

void __thiscall helics::apps::SourceObject::SourceObject(SourceObject *this,Publication *p,Time per)

{
  Publication::Publication(&this->pub,p);
  (this->period).internalTimeCode = per.internalTimeCode;
  (this->nextTime).internalTimeCode = 0;
  this->generatorIndex = -1;
  (this->generatorName)._M_dataplus._M_p = (pointer)&(this->generatorName).field_2;
  (this->generatorName)._M_string_length = 0;
  (this->generatorName).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

SourceObject(const Publication& p, Time per): pub(p), period(per) {}